

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqpvalue.c
# Opt level: O0

int encode_long(AMQPVALUE_ENCODER_OUTPUT encoder_output,void *context,int64_t value)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  bool local_31;
  LOGGER_LOG l;
  _Bool use_smallest;
  int result;
  int64_t value_local;
  void *context_local;
  AMQPVALUE_ENCODER_OUTPUT encoder_output_local;
  
  local_31 = value < 0x80 && -0x81 < value;
  iVar1 = encode_long_constructor(encoder_output,context,local_31);
  if ((iVar1 == 0) && (iVar1 = encode_long_value(encoder_output,context,value,local_31), iVar1 == 0)
     ) {
    l._4_4_ = 0;
  }
  else {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqpvalue.c"
                ,"encode_long",0xc33,1,"Failed encoding long");
    }
    l._4_4_ = 0xc34;
  }
  return l._4_4_;
}

Assistant:

static int encode_long(AMQPVALUE_ENCODER_OUTPUT encoder_output, void* context, int64_t value)
{
    int result;
    bool use_smallest = ((value <= 127) && (value >= -128));

    if ((encode_long_constructor(encoder_output, context, use_smallest) != 0) ||
        (encode_long_value(encoder_output, context, value, use_smallest) != 0))
    {
        /* Codes_SRS_AMQPVALUE_01_274: [When the encoder output function fails, amqpvalue_encode shall fail and return a non-zero value.] */
        LogError("Failed encoding long");
        result = MU_FAILURE;
    }
    else
    {
        /* Codes_SRS_AMQPVALUE_01_266: [On success amqpvalue_encode shall return 0.] */
        result = 0;
    }

    return result;
}